

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O2

void __thiscall
burst::k_ary_search_set<int,std::less<void>>::initialize<boost::iterator_range<int_const*>>
          (k_ary_search_set<int,std::less<void>> *this,iterator_range<const_int_*> *range)

{
  int *__last;
  int *piVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  value_container_type buffer;
  _Vector_base<int,_std::allocator<int>_> local_48;
  iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_28;
  
  piVar1 = std::
           __adjacent_find<int_const*,__gnu_cxx::__ops::_Iter_comp_iter<burst::not_fn_t<std::less<void>>>>
                     ((range->
                      super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                      ).
                      super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                      .
                      super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                      .m_Begin,(range->
                               super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                               ).
                               super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                               .
                               super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                               .m_End);
  __last = (range->
           super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
           super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
           super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
           m_End;
  if (piVar1 != __last) {
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_48,
               (range->
               super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
               ).
               super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
               .m_Begin,__last,(allocator_type *)&local_28);
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
              (local_48._M_impl.super__Vector_impl_data._M_start,
               local_48._M_impl.super__Vector_impl_data._M_finish);
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<burst::not_fn_t<std::less<void>>>>
                        (local_48._M_impl.super__Vector_impl_data._M_start,
                         local_48._M_impl.super__Vector_impl_data._M_finish);
    std::vector<int,_std::allocator<int>_>::erase
              ((vector<int,_std::allocator<int>_> *)&local_48,(const_iterator)__first._M_current,
               (const_iterator)local_48._M_impl.super__Vector_impl_data._M_finish);
    local_28.
    super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
    .m_Begin._M_current = local_48._M_impl.super__Vector_impl_data._M_start;
    local_28.
    super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
    .m_End._M_current = local_48._M_impl.super__Vector_impl_data._M_finish;
    initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
              (this,&local_28);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    return;
  }
  initialize_trusted<boost::iterator_range<int_const*>>(this,range);
  return;
}

Assistant:

void initialize (const RandomAccessRange & range)
        {
            const auto is_sorted_and_unique =
                std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end();
            if (is_sorted_and_unique)
            {
                initialize_trusted(range);
            }
            else
            {
                value_container_type buffer(range.begin(), range.end());
                std::sort(buffer.begin(), buffer.end(), m_compare);
                buffer.erase
                (
                    std::unique(buffer.begin(), buffer.end(), burst::not_fn(m_compare)),
                    buffer.end()
                );

                initialize_trusted(boost::make_iterator_range(buffer));
            }
        }